

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::
getConstraintsBounds
          (MultipleShootingTranscription *this,VectorDynSize *constraintsLowerBounds,
          VectorDynSize *constraintsUpperBounds)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  
  bVar1 = this->m_prepared;
  if (bVar1 == false) {
    iDynTree::reportError
              ("MultipleShootingTranscription","getConstraintsInfo",
               "First you need to call the prepare method");
  }
  else {
    uVar3 = iDynTree::VectorDynSize::size();
    uVar2 = (*(this->super_OptimizationProblem)._vptr_OptimizationProblem[5])(this);
    if (uVar3 != uVar2) {
      (*(this->super_OptimizationProblem)._vptr_OptimizationProblem[5])(this);
      iDynTree::VectorDynSize::resize((ulong)constraintsLowerBounds);
    }
    uVar3 = iDynTree::VectorDynSize::size();
    uVar2 = (*(this->super_OptimizationProblem)._vptr_OptimizationProblem[5])(this);
    if (uVar3 != uVar2) {
      (*(this->super_OptimizationProblem)._vptr_OptimizationProblem[5])(this);
      iDynTree::VectorDynSize::resize((ulong)constraintsUpperBounds);
    }
    iDynTree::VectorDynSize::operator=(constraintsLowerBounds,&this->m_constraintsLowerBound);
    iDynTree::VectorDynSize::operator=(constraintsUpperBounds,&this->m_constraintsUpperBound);
  }
  return bVar1;
}

Assistant:

virtual bool getConstraintsBounds(VectorDynSize& constraintsLowerBounds, VectorDynSize& constraintsUpperBounds) override {
                if (!(m_prepared)){
                    reportError("MultipleShootingTranscription", "getConstraintsInfo", "First you need to call the prepare method");
                    return false;
                }

                if (constraintsLowerBounds.size() != numberOfConstraints()) {
                    constraintsLowerBounds.resize(numberOfConstraints());
                }

                if (constraintsUpperBounds.size() != numberOfConstraints()) {
                    constraintsUpperBounds.resize(numberOfConstraints());
                }

                constraintsLowerBounds = m_constraintsLowerBound;
                constraintsUpperBounds = m_constraintsUpperBound;

                return true;
            }